

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

bool __thiscall
ChebTools::ChebyshevExpansion::has_real_roots_Descartes(ChebyshevExpansion *this,double reltol)

{
  size_t sVar1;
  size_t sVar2;
  ArrayXd coeff_shift_xmax;
  ArrayXd coeff_shift_xmin;
  ArrayXd coefderiv_mono;
  ArrayXd local_78;
  ArrayXd local_68;
  double local_58;
  ArrayXd local_50;
  ChebyshevExpansion *local_40;
  ArrayXd local_38;
  undefined1 local_28 [16];
  ChebyshevExpansion *local_18;
  
  local_58 = reltol;
  to_monomial_increasing((ChebyshevExpansion *)local_28);
  local_40 = (ChebyshevExpansion *)local_28;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_78,
             (DenseBase<Eigen::Reverse<Eigen::Array<double,__1,_1,_0,__1,_1>,_2>_> *)&local_40);
  has_real_roots_Descartes::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&local_68,&local_78,-1.0);
  local_50.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)&local_68;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_38,
             (DenseBase<Eigen::Reverse<Eigen::Array<double,__1,_1,_0,__1,_1>,_2>_> *)&local_50);
  free(local_68.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_78.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  local_18 = (ChebyshevExpansion *)local_28;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_50,
             (DenseBase<Eigen::Reverse<Eigen::Array<double,__1,_1,_0,__1,_1>,_2>_> *)&local_18);
  has_real_roots_Descartes::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&local_78,&local_50,1.0);
  local_40 = (ChebyshevExpansion *)&local_78;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Reverse<Eigen::Array<double,_1,1,0,_1,1>,2>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_68,
             (DenseBase<Eigen::Reverse<Eigen::Array<double,__1,_1,_0,__1,_1>,_2>_> *)&local_40);
  free(local_78.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_50.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  sVar1 = count_sign_changes(&local_38,local_58);
  sVar2 = count_sign_changes(&local_68,local_58);
  free(local_68.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_38.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free((void *)local_28._0_8_);
  return (int)sVar2 != (int)sVar1;
}

Assistant:

bool ChebyshevExpansion::has_real_roots_Descartes(const double reltol) const {
        
        // Turn derivative expansion into polynomial
        // as monomial-basis in increasing order
        auto coefderiv_mono = to_monomial_increasing();
    
        // Optimized Polynomial Taylor shift using the Horner method
        // See: http://www.hvks.com/Numerical/Downloads/HVE%20Polynomial%20Taylor%20shifting.pdf
        auto shift_poly_Horner = [](const Eigen::ArrayXd& a_decreasing, double shift){
            int n = a_decreasing.size()-1;
            Eigen::ArrayXd a = a_decreasing;
            if (shift == 0) return a; // No shift, no change
            for (int j = 1; j <= n; ++j){
                for (int i = 1; i <= n - j + 1; ++i){
                    a[i] += shift*a[i - 1];
                }
            }
            return a;
        };
        
        Eigen::ArrayXd coeff_shift_xmin = shift_poly_Horner(coefderiv_mono.reverse(), -1).reverse();
        Eigen::ArrayXd coeff_shift_xmax = shift_poly_Horner(coefderiv_mono.reverse(), 1).reverse();
//        std::cout << coeff_shift_xmin << std::endl;
//        std::cout << coeff_shift_xmax << std::endl;
        int N_changes_xmin = count_sign_changes(coeff_shift_xmin, reltol); // Number of roots in [-1, inf)
        int N_changes_xmax = count_sign_changes(coeff_shift_xmax, reltol); // Number of roots in [1, inf)
        
        // Difference between these two are the number of roots inside [-1,1]
        int N_changes_n11 = N_changes_xmax - N_changes_xmin;
        
        // If the same, there are no additional extrema in [-1, 1], and the function is monotonic
        return (N_changes_n11 != 0);
    }